

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::beta_dist<long_double>>(beta_dist<long_double> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  AssertionHandler *this;
  beta_dist<long_double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  beta_dist<long_double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd58;
  undefined2 in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  beta_dist<long_double> *in_stack_fffffffffffffd60;
  AssertionHandler *this_00;
  StringRef *macroName;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  param_type *in_stack_fffffffffffffd80;
  param_type *in_stack_fffffffffffffd88;
  AssertionHandler *in_stack_fffffffffffffd90;
  param_type *in_stack_fffffffffffffdf8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  stringstream local_1c0 [16];
  StringRef local_1b0 [26];
  beta_dist<long_double> *local_8;
  
  local_8 = in_RDI;
  trng::beta_dist<long_double>::param_type::param_type(in_stack_fffffffffffffd80);
  std::__cxx11::stringstream::stringstream(local_1c0);
  macroName = local_1b0;
  this = (AssertionHandler *)trng::beta_dist<long_double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
  trng::operator>>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  trng::beta_dist<long_double>::beta_dist
            (in_stack_fffffffffffffd60,
             (param_type *)
             CONCAT17(in_stack_fffffffffffffd5f,
                      CONCAT16(in_stack_fffffffffffffd5e,
                               CONCAT24(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58))));
  operator____catch_sr
            ((char *)in_stack_fffffffffffffd60,
             CONCAT17(in_stack_fffffffffffffd5f,
                      CONCAT16(in_stack_fffffffffffffd5e,
                               CONCAT24(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58))));
  this_00 = (AssertionHandler *)&stack0xfffffffffffffd90;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffd7f;
  capturedExpression.m_start._0_7_ = in_stack_fffffffffffffd78;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd80;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             CONCAT13(in_stack_fffffffffffffd5f,
                      CONCAT12(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd5c)));
  bVar1 = trng::operator==((beta_dist<long_double> *)this_00,
                           (beta_dist<long_double> *)
                           CONCAT17(in_stack_fffffffffffffd5f,
                                    CONCAT16(in_stack_fffffffffffffd5e,
                                             CONCAT24(in_stack_fffffffffffffd5c,
                                                      in_stack_fffffffffffffd58))));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffd5e,
                                     CONCAT24(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffd90,(ExprLhs<bool> *)in_stack_fffffffffffffd88);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}